

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxvfmt.cpp
# Opt level: O0

void rw::xbox::registerVertexFormatPlugin(void)

{
  vertexFmtOffset = Geometry::registerPlugin(4,0x511,createVertexFmt,(Destructor)0x0,copyVertexFmt);
  Geometry::registerPluginStream(0x511,readVertexFmt,writeVertexFmt,getSizeVertexFmt);
  return;
}

Assistant:

void
registerVertexFormatPlugin(void)
{
	vertexFmtOffset = Geometry::registerPlugin(sizeof(uint32), ID_VERTEXFMT,
	                         createVertexFmt, nil, copyVertexFmt);
	Geometry::registerPluginStream(ID_VERTEXFMT,
	                               readVertexFmt,
	                               writeVertexFmt,
	                               getSizeVertexFmt);
}